

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_line_element.hpp
# Opt level: O2

void __thiscall UrlLineElement::~UrlLineElement(UrlLineElement *this)

{
  ~UrlLineElement(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~UrlLineElement() {}